

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O2

void initialize_font_from_file(Display *dpy,int param_2,char *font_name,XFontStruct **font_info)

{
  undefined8 uVar1;
  XFontStruct *pXVar2;
  undefined8 *puVar3;
  int actual_count;
  
  pXVar2 = (XFontStruct *)XLoadQueryFont(dpy,font_name);
  *font_info = pXVar2;
  if (pXVar2 == (XFontStruct *)0x0) {
    fwrite("initialize_font_from_file: Could not open font\n",0x2f,1,_stderr);
    fprintf(_stderr,"  \"%s\".  Resorting to default font.\n",font_name);
    puVar3 = (undefined8 *)
             XListFonts(dpy,"*-*-fixed-medium-r-*--*-120-*-*-*-*-iso8859-1",1,&actual_count);
    uVar1 = *puVar3;
    pXVar2 = (XFontStruct *)XLoadQueryFont(dpy,uVar1);
    *font_info = pXVar2;
    if (pXVar2 == (XFontStruct *)0x0) {
      fwrite("initialize_font_from_file: Could not open default\n",0x32,1,_stderr);
      fprintf(_stderr,"  font \"%s\" either.  Exiting...\n",uVar1);
    }
    XFreeFontNames(puVar3);
  }
  return;
}

Assistant:

void
initialize_font_from_file(Display *dpy, int /*screen_number*/,
                          const char *font_name, XFontStruct **font_info)
{
  // If the font is valid, you just have to call XLoadQueryFont on it.
  // If it is bogus, you have to do a lot of work to revert to a default font.

  if ((*font_info = XLoadQueryFont(dpy, font_name)) == nullptr) {
    fprintf(stderr, "initialize_font_from_file: Could not open font\n");
    fprintf(stderr, "  \"%s\".  Resorting to default font.\n", font_name);

    // This implementation of reverting to a default font requires that
    // you already know the name of a font that you want to revert to.
    // (Am_DEFAULT_FONT_NAME is defined in gemX.h)
    char **result;
    int actual_count;
    result = XListFonts(dpy, Am_DEFAULT_FONT_NAME, 1, &actual_count);
    font_name = result[0];
    if ((*font_info = XLoadQueryFont(dpy, font_name)) == nullptr) {
      fprintf(stderr, "initialize_font_from_file: Could not open default\n");
      fprintf(stderr, "  font \"%s\" either.  Exiting...\n", font_name);
    }
    XFreeFontNames(result);

    /*      
    // This is the recommended way to get properties of the default font.
    // However, XQueryFont, in it's infinite wisdom, sets the fid slot of the
    // XFontStruct to have the fid of the GC, rather than the default font.
    // This will thwart our later attempt to set the font with XSetFont,
    // since the fid would be wrong, unless we can find out the fid that we
    // want and install it, undoing X's helpful confusion of the GC fid.
    GC default_gc = DefaultGC(dpy, screen_number);
    *font_info = XQueryFont(dpy, XGContextFromGC(default_gc));

    // By asking the default GC about its font, we can identify the
    // default font and install it ourselves in the XFontStruct.
    XGCValues values;
    if (XGetGCValues (dpy, default_gc, GCFont, &values) == 0)
      Am_Error ("** initialize_font_from_file: could not get GC values.\n");
    // Note: Calling XQueryFont on this font (and attempting to do all of this
    // in one step instead of two) does not work -- XQueryFont will return nullptr
    // for the properties of the default font unless you ask for them in the
    // recommended way above.  Thanks, X!
    (*font_info)->fid = values.font;
    */
  }
}